

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_function-c.cpp
# Opt level: O2

duckdb_table_function duckdb_create_table_function(void)

{
  TableFunction *this;
  shared_ptr<duckdb::CTableFunctionInfo,_true> local_58;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_48;
  string local_30;
  
  this = (TableFunction *)operator_new(0x1b8);
  std::__cxx11::string::string
            ((string *)&local_30,anon_var_dwarf_4b4b1b2 + 9,(allocator *)&local_58);
  local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duckdb::TableFunction::TableFunction
            (this,&local_30,(vector<duckdb::LogicalType,_true> *)&local_48,duckdb::CTableFunction,
             duckdb::CTableFunctionBind,duckdb::CTableFunctionInit,duckdb::CTableFunctionLocalInit);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
  std::__cxx11::string::~string((string *)&local_30);
  duckdb::make_shared_ptr<duckdb::CTableFunctionInfo>();
  duckdb::shared_ptr<duckdb::TableFunctionInfo,_true>::operator=<duckdb::CTableFunctionInfo,_0>
            (&this->function_info,&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.internal.
              super___shared_ptr<duckdb::CTableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  this->cardinality = duckdb::CTableFunctionCardinality;
  return (duckdb_table_function)this;
}

Assistant:

duckdb_table_function duckdb_create_table_function() {
	auto function = new duckdb::TableFunction("", {}, duckdb::CTableFunction, duckdb::CTableFunctionBind,
	                                          duckdb::CTableFunctionInit, duckdb::CTableFunctionLocalInit);
	function->function_info = duckdb::make_shared_ptr<duckdb::CTableFunctionInfo>();
	function->cardinality = duckdb::CTableFunctionCardinality;
	return reinterpret_cast<duckdb_table_function>(function);
}